

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O3

void __thiscall adios2::ADIOS::EnterComputationBlock(ADIOS *this)

{
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"in call to ADIOS::EnterComputationBlock()","");
  CheckPointer(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  adios2::core::ADIOS::EnterComputationBlock();
  return;
}

Assistant:

void ADIOS::EnterComputationBlock() noexcept
{
    CheckPointer("in call to ADIOS::EnterComputationBlock()");
    m_ADIOS->EnterComputationBlock();
}